

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::MergeUsingImpl
          (Parser *this,ZeroCopyInputStream *param_1,Message *output,ParserImpl *parser_impl)

{
  bool bVar1;
  string_view message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_fields;
  long *local_d8;
  undefined8 local_d0;
  long local_c8 [2];
  undefined1 local_b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  AlphaNum local_80;
  undefined8 local_50;
  long *local_48;
  
  bVar1 = ParserImpl::Parse(parser_impl,output);
  if (bVar1) {
    if (this->allow_partial_ != false) {
      return true;
    }
    bVar1 = MessageLite::IsInitialized(&output->super_MessageLite);
    if (bVar1) {
      return true;
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Message::FindInitializationErrors(output,&local_98);
    local_80.piece_._M_len = 0x21;
    local_80.piece_._M_str = "Message missing required fields: ";
    absl::lts_20240722::strings_internal::
    JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (&local_d8,
               (strings_internal *)
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,2,", ");
    local_50 = local_d0;
    local_48 = local_d8;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b8,&local_80);
    message._M_str = (char *)local_b8._0_8_;
    message._M_len = local_b8._8_8_;
    ParserImpl::ReportError(parser_impl,-1,0,message);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  return false;
}

Assistant:

bool TextFormat::Parser::MergeUsingImpl(io::ZeroCopyInputStream* /* input */,
                                        Message* output,
                                        ParserImpl* parser_impl) {
  if (!parser_impl->Parse(output)) return false;
  if (!allow_partial_ && !output->IsInitialized()) {
    std::vector<std::string> missing_fields;
    output->FindInitializationErrors(&missing_fields);
    parser_impl->ReportError(-1, 0,
                             absl::StrCat("Message missing required fields: ",
                                          absl::StrJoin(missing_fields, ", ")));
    return false;
  }
  return true;
}